

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::anon_unknown_6::ScanLineProcess::run_fill
          (ScanLineProcess *this,FrameBuffer *outfb,int fbY,
          vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *filllist)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  ushort uVar6;
  ArgExc *this_00;
  float fVar7;
  uint uVar8;
  undefined4 in_register_00000014;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int *piVar14;
  float *pfVar15;
  float *pfVar16;
  
  iVar11 = (int)outfb;
  piVar14 = *(int **)CONCAT44(in_register_00000014,fbY);
  piVar2 = (int *)((undefined8 *)CONCAT44(in_register_00000014,fbY))[1];
  do {
    if (piVar14 == piVar2) {
      return;
    }
    iVar9 = ((this->cinfo).height + (this->cinfo).start_y) - (this->decoder).user_line_end_ignore;
    if (iVar11 < iVar9) {
      lVar3 = *(long *)(piVar14 + 4);
      lVar4 = *(long *)(piVar14 + 6);
      pfVar15 = (float *)((iVar11 / piVar14[9]) * lVar4 +
                         ((this->cinfo).start_x / piVar14[8]) * lVar3 + *(long *)(piVar14 + 2));
      iVar12 = iVar11;
      do {
        if (iVar12 % piVar14[9] == 0) {
          iVar10 = (this->cinfo).width;
          if (0 < iVar10) {
            iVar13 = (this->cinfo).start_x;
            iVar10 = iVar10 + iVar13;
            pfVar16 = pfVar15;
            do {
              if (iVar13 % piVar14[8] == 0) {
                iVar1 = *piVar14;
                if (iVar1 == 2) {
                  *pfVar16 = (float)*(double *)(piVar14 + 10);
                }
                else if (iVar1 == 1) {
                  fVar7 = ABS((float)*(double *)(piVar14 + 10));
                  uVar6 = (ushort)((uint)(float)*(double *)(piVar14 + 10) >> 0x10) & 0x8000;
                  if ((uint)fVar7 < 0x38800000) {
                    if ((0x33000000 < (uint)fVar7) &&
                       (uVar8 = (uint)fVar7 & 0x7fffff | 0x800000,
                       cVar5 = (char)((uint)fVar7 >> 0x17),
                       uVar6 = uVar6 | (ushort)(uVar8 >> (0x7eU - cVar5 & 0x1f)),
                       0x80000000 < uVar8 << (cVar5 + 0xa2U & 0x1f))) {
                      uVar6 = uVar6 + 1;
                    }
                  }
                  else if ((uint)fVar7 < 0x7f800000) {
                    if ((uint)fVar7 < 0x477ff000) {
                      uVar6 = (ushort)((int)fVar7 + 0x8000fff +
                                       (uint)(((uint)fVar7 >> 0xd & 1) != 0) >> 0xd) | uVar6;
                    }
                    else {
                      uVar6 = uVar6 | 0x7c00;
                    }
                  }
                  else {
                    uVar6 = uVar6 | 0x7c00;
                    if (fVar7 != INFINITY) {
                      uVar8 = (uint)fVar7 >> 0xd & 0x3ff;
                      uVar6 = uVar6 | (ushort)uVar8 | (ushort)(uVar8 == 0);
                    }
                  }
                  *(ushort *)pfVar16 = uVar6;
                }
                else {
                  if (iVar1 != 0) {
                    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_4::ArgExc::ArgExc(this_00,"Unknown pixel data type.");
                    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                  }
                  *pfVar16 = (float)(long)*(double *)(piVar14 + 10);
                }
                pfVar16 = (float *)((long)pfVar16 + lVar3);
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < iVar10);
          }
          pfVar15 = (float *)((long)pfVar15 + lVar4);
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < iVar9);
    }
    piVar14 = piVar14 + 0xe;
  } while( true );
}

Assistant:

void ScanLineProcess::run_fill (
    const FrameBuffer *outfb,
    int fbY,
    const std::vector<Slice> &filllist)
{
    for (auto& s: filllist)
    {
        uint8_t*       ptr;

        ptr  = reinterpret_cast<uint8_t*> (s.base);
        ptr += int64_t (cinfo.start_x / s.xSampling) * int64_t (s.xStride);
        ptr += int64_t (fbY / s.ySampling) * int64_t (s.yStride);

        // TODO: update ImfMisc, lift fill type / value
        int stop = cinfo.start_y + cinfo.height - decoder.user_line_end_ignore;
        for ( int start = fbY; start < stop; ++start )
        {
            if (start % s.ySampling) continue;

            uint8_t* outptr = ptr;
            for ( int sx = cinfo.start_x, ex = cinfo.start_x + cinfo.width;
                  sx < ex; ++sx )
            {
                if (sx % s.xSampling) continue;

                switch (s.type)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
                    {
                        unsigned int fillVal = (unsigned int) (s.fillValue);
                        *(unsigned int*)outptr = fillVal;
                        break;
                    }

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:
                    {
                        half fillVal = half (s.fillValue);
                        *(half*)outptr = fillVal;
                        break;
                    }

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:
                    {
                        float fillVal = float (s.fillValue);
                        *(float*)outptr = fillVal;
                        break;
                    }
                    default:
                        throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
                }
                outptr += s.xStride;
            }

            ptr += s.yStride;
        }
    }
}